

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::ByteSize(Message *message)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar3;
  UnknownFieldSet *pUVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  FieldDescriptor **local_58;
  iterator iStack_50;
  FieldDescriptor **local_48;
  long *local_40;
  FieldDescriptor *local_38;
  long lVar2;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  local_40 = (long *)CONCAT44(extraout_var_00,iVar1);
  local_58 = (FieldDescriptor **)0x0;
  iStack_50._M_current = (FieldDescriptor **)0x0;
  local_48 = (FieldDescriptor **)0x0;
  if (*(char *)(*(long *)(lVar2 + 0x20) + 0x6b) == '\x01') {
    if (0 < *(int *)(lVar2 + 0x2c)) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        local_38 = (FieldDescriptor *)(*(long *)(lVar2 + 0x30) + lVar5);
        if (iStack_50._M_current == local_48) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&local_58,iStack_50,&local_38);
        }
        else {
          *iStack_50._M_current = local_38;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0xa8;
      } while (lVar6 < *(int *)(lVar2 + 0x2c));
    }
  }
  else {
    (**(code **)(*local_40 + 0x80))(local_40,message,&local_58);
  }
  if (iStack_50._M_current == local_58) {
    lVar5 = 0;
  }
  else {
    uVar7 = 0;
    lVar5 = 0;
    do {
      sVar3 = FieldByteSize(local_58[uVar7],message);
      lVar5 = lVar5 + sVar3;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)iStack_50._M_current - (long)local_58 >> 3));
  }
  if (*(char *)(*(long *)(lVar2 + 0x20) + 0x68) == '\0') {
    pUVar4 = (UnknownFieldSet *)(**(code **)(*local_40 + 0x10))(local_40,message);
    sVar3 = ComputeUnknownFieldsSize(pUVar4);
  }
  else {
    pUVar4 = (UnknownFieldSet *)(**(code **)(*local_40 + 0x10))(local_40,message);
    sVar3 = ComputeUnknownMessageSetItemsSize(pUVar4);
  }
  if (local_58 != (FieldDescriptor **)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return sVar3 + lVar5;
}

Assistant:

size_t WireFormat::ByteSize(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = 0;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (int i = 0; i < fields.size(); i++) {
    our_size += FieldByteSize(fields[i], message);
  }

  if (descriptor->options().message_set_wire_format()) {
    our_size += ComputeUnknownMessageSetItemsSize(
      message_reflection->GetUnknownFields(message));
  } else {
    our_size += ComputeUnknownFieldsSize(
      message_reflection->GetUnknownFields(message));
  }

  return our_size;
}